

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<std::vector<NodeView,_std::allocator<NodeView>_>,_std::unique_ptr<std::vector<NodeView,_std::allocator<NodeView>_>,_std::default_delete<std::vector<NodeView,_std::allocator<NodeView>_>_>_>_>
* __thiscall
pybind11::class_<std::vector<NodeView,std::allocator<NodeView>>,std::unique_ptr<std::
vector<NodeView,std::allocator<NodeView>>,std::default_delete<std::vector<NodeView,std::
allocator<NodeView>>>>>::def<bool(*)(std::vector<NodeView,std::allocator<NodeView>>const&,std::
vector<NodeView,std::allocator<NodeView>>const&),pybind11::operator>
          (allocator<NodeView>>const___pybind11 *this,char *name_,
          _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
          **f,is_operator *extra)

{
  _func_bool_vector<NodeView,_std::allocator<NodeView>_>_ptr_vector<NodeView,_std::allocator<NodeView>_>_ptr
  *f_00;
  cpp_function cf;
  handle local_58;
  cpp_function local_50;
  object local_48;
  is_method local_40;
  name local_38;
  sibling local_30;
  
  f_00 = *f;
  local_40.class_.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.value = name_;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_30.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::cpp_function<bool,std::vector<NodeView,std::allocator<NodeView>>const&,std::
  vector<NodeView,std::allocator<NodeView>>const&,pybind11::name,pybind11::is_method,pybind11::
  sibling,pybind11::operator>
            ((sibling_pybind11 *)&local_50,f_00,&local_38,&local_40,&local_30,extra);
  object::~object((object *)&local_58);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_50);
  object::~object((object *)&local_50);
  return (class_<std::vector<NodeView,_std::allocator<NodeView>_>,_std::unique_ptr<std::vector<NodeView,_std::allocator<NodeView>_>,_std::default_delete<std::vector<NodeView,_std::allocator<NodeView>_>_>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }